

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

string * __thiscall
cfd::core::SigHashType::ToString_abi_cxx11_(string *__return_storage_ptr__,SigHashType *this)

{
  uint uVar1;
  string result;
  _Alloc_hider local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_30 = 0;
  local_28 = '\0';
  uVar1 = this->hash_algorithm_ - kSigHashAll;
  local_38._M_p = &local_28;
  if (uVar1 < 3) {
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_38,0,(char *)0x0,
               (ulong)(&DAT_00596edc + *(int *)(&DAT_00596edc + (ulong)uVar1 * 4)));
    if (this->is_anyone_can_pay_ == true) {
      ::std::__cxx11::string::append((char *)&local_38);
    }
    if (this->is_fork_id_ == true) {
      ::std::__cxx11::string::append((char *)&local_38);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_38._M_p == &local_28) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
    }
    __return_storage_ptr__->_M_string_length = local_30;
    local_30 = 0;
    local_28 = '\0';
    local_38._M_p = &local_28;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (local_38._M_p != &local_28) {
    operator_delete(local_38._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SigHashType::ToString() const {
  std::string result;
  if (hash_algorithm_ == kSigHashAll) {
    result = "ALL";
  } else if (hash_algorithm_ == kSigHashNone) {
    result = "NONE";
  } else if (hash_algorithm_ == kSigHashSingle) {
    result = "SINGLE";
  } else {
    return "";
  }
  if (is_anyone_can_pay_) result += "|ANYONECANPAY";
  if (is_fork_id_) result += "|RANGEPROOF";
  return result;
}